

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_fixture.c
# Opt level: O2

REF_STATUS
ref_fixture_pri_brick_args_grid
          (REF_GRID_conflict *ref_grid_ptr,REF_MPI ref_mpi,REF_DBL x0,REF_DBL x1,REF_DBL y0,
          REF_DBL y1,REF_DBL z0,REF_DBL z1,REF_INT l,REF_INT m,REF_INT n,REF_INT l0)

{
  REF_GRID_conflict pRVar1;
  REF_NODE ref_node;
  REF_DBL *pRVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  undefined8 uVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  int iVar19;
  undefined4 in_register_00000084;
  char *pcVar20;
  int iVar21;
  ulong uVar22;
  int iVar23;
  int iVar24;
  uint uVar25;
  ulong uVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  uint local_128;
  uint local_120;
  REF_INT cell;
  ulong local_110;
  REF_INT quad [5];
  int local_d0;
  uint local_c8;
  int local_c4;
  uint local_c0;
  int local_bc;
  uint local_b8;
  uint uStack_b4;
  uint uStack_b0;
  REF_INT local_ac;
  undefined8 local_a8;
  uint local_9c;
  double local_98;
  double local_90;
  ulong local_88;
  double local_80;
  REF_INT pri [6];
  REF_INT node;
  REF_NODE local_38;
  
  local_a8 = CONCAT44(in_register_00000084,n);
  uVar6 = 0;
  if (0 < l0) {
    uVar6 = l0;
  }
  uVar14 = l - 1;
  if ((int)uVar14 <= (int)uVar6) {
    uVar6 = uVar14;
  }
  local_98 = x0;
  local_90 = y0;
  local_80 = z0;
  uVar5 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar5 == 0) {
    pRVar1 = *ref_grid_ptr;
    ref_node = pRVar1->node;
    iVar8 = (int)local_a8;
    local_9c = uVar14;
    if (pRVar1->mpi->id == 0) {
      dVar33 = x1 - local_98;
      dVar31 = y1 - local_90;
      iVar7 = iVar8 + -1;
      dVar29 = z1 - local_80;
      lVar17 = 0;
      uVar26 = 0;
      if (0 < l) {
        uVar26 = (ulong)(uint)l;
      }
      iVar19 = 0;
      if (0 < m) {
        iVar19 = m;
      }
      iVar9 = 0;
      if (0 < iVar8) {
        iVar9 = iVar8;
      }
      uVar5 = m * l;
      dVar30 = local_80;
      dVar32 = local_90;
      local_110 = (ulong)(uint)l;
      local_88 = (ulong)uVar6;
      for (iVar8 = 0; iVar8 != iVar9; iVar8 = iVar8 + 1) {
        dVar27 = (double)iVar8 * (dVar29 / (double)iVar7) + dVar30;
        lVar16 = lVar17;
        for (iVar23 = 0; iVar23 != iVar19; iVar23 = iVar23 + 1) {
          dVar28 = (double)iVar23 * (dVar31 / (double)(m + -1)) + dVar32;
          for (uVar22 = 0; uVar26 != uVar22; uVar22 = uVar22 + 1) {
            uVar6 = ref_node_add(ref_node,(long)((int)lVar16 + (int)uVar22),&node);
            if (uVar6 != 0) {
              uVar26 = (ulong)uVar6;
              pcVar20 = "node";
              uVar13 = 0x5a6;
              goto LAB_00125c8a;
            }
            pRVar2 = ref_node->real;
            lVar12 = (long)node;
            pRVar2[lVar12 * 0xf] = (double)(int)uVar22 * (dVar33 / (double)(int)uVar14) + local_98;
            pRVar2[lVar12 * 0xf + 1] = dVar28;
            pRVar2[lVar12 * 0xf + 2] = dVar27;
            dVar30 = local_80;
            dVar32 = local_90;
          }
          lVar16 = lVar16 + (ulong)(uint)l;
        }
        lVar17 = lVar17 + (ulong)uVar5;
      }
      local_bc = (int)local_110;
      iVar19 = local_bc * (m + 1);
      uVar6 = 0;
      uVar22 = local_110;
      uVar13 = local_a8;
      local_c0 = uVar5;
      local_38 = ref_node;
      for (iVar8 = 1; iVar21 = 1, iVar9 = iVar19, iVar23 = local_bc, uVar14 = local_c0,
          uVar10 = uVar6, iVar8 < (int)uVar13; iVar8 = iVar8 + 1) {
        while( true ) {
          local_90 = (double)(ulong)uVar10;
          local_98 = (double)(ulong)uVar14;
          if (m <= iVar21) break;
          iVar24 = 0;
          while( true ) {
            iVar15 = (int)uVar22;
            iVar3 = SUB84(local_90,0);
            iVar4 = SUB84(local_98,0);
            if (iVar15 <= iVar24 + 1) break;
            pri[1] = iVar3 + iVar24 + 1;
            pri[2] = iVar23 + 1 + iVar24;
            pri[4] = iVar4 + 1 + iVar24;
            iVar15 = iVar9 + 1 + iVar24;
            local_80 = (double)CONCAT44(local_80._4_4_,pri[2]);
            pri[0] = iVar3 + iVar24;
            pri[3] = iVar4 + iVar24;
            pri[5] = iVar15;
            uVar14 = ref_cell_add(pRVar1->cell[10],pri,&cell);
            if (uVar14 != 0) {
              uVar26 = (ulong)uVar14;
              pcVar20 = "pri";
              uVar13 = 0x5c0;
              goto LAB_00125c8a;
            }
            pri[5] = iVar9 + iVar24;
            pri[2] = iVar24 + iVar23;
            pri[1] = local_80._0_4_;
            pri[0] = iVar3 + iVar24;
            pri[3] = iVar4 + iVar24;
            pri[4] = iVar15;
            uVar14 = ref_cell_add(pRVar1->cell[10],pri,&cell);
            uVar26 = (ulong)uVar14;
            uVar22 = local_110;
            iVar24 = iVar24 + 1;
            if (uVar14 != 0) {
              pcVar20 = "pri";
              uVar13 = 0x5c7;
              goto LAB_00125c8a;
            }
          }
          iVar21 = iVar21 + 1;
          uVar13 = local_a8;
          iVar9 = iVar9 + iVar15;
          iVar23 = iVar23 + iVar15;
          uVar14 = iVar4 + iVar15;
          uVar10 = iVar3 + iVar15;
        }
        local_c0 = local_c0 + uVar5;
        uVar6 = uVar6 + uVar5;
        iVar19 = iVar19 + uVar5;
        local_bc = local_bc + uVar5;
      }
      quad[4] = 1;
      iVar19 = (m + 1) * (int)uVar22;
      iVar9 = 0;
      for (iVar8 = 1; iVar8 < (int)local_a8; iVar8 = iVar8 + 1) {
        iVar21 = 0;
        iVar23 = iVar9;
        while (iVar21 = iVar21 + 1, iVar21 < m) {
          iVar24 = (int)local_110;
          quad[1] = iVar24 + iVar23;
          quad[3] = uVar5 + iVar23;
          quad[2] = iVar19 + iVar23;
          quad[0] = iVar23;
          uVar6 = ref_cell_add(pRVar1->cell[6],quad,&cell);
          uVar26 = (ulong)uVar6;
          iVar23 = iVar23 + iVar24;
          if (uVar6 != 0) {
            pcVar20 = "qua";
            uVar13 = 0x5d3;
            goto LAB_00125c8a;
          }
        }
        iVar9 = iVar9 + uVar5;
      }
      quad[4] = 2;
      iVar19 = iVar19 + -1;
      local_120 = (m + 2) * (int)local_110 + -1;
      local_d0 = (int)local_110 * 2 + -1;
      for (local_128 = 1; (int)local_128 < (int)local_a8; local_128 = local_128 + 1) {
        iVar23 = 0;
        iVar9 = local_d0;
        uVar6 = local_120;
        uVar14 = local_9c;
        iVar8 = iVar19;
        while (iVar23 = iVar23 + 1, iVar23 < m) {
          iVar21 = (int)local_110;
          quad[0] = iVar9;
          quad[1] = uVar14;
          quad[2] = iVar8;
          quad[3] = uVar6;
          uVar10 = ref_cell_add(pRVar1->cell[6],quad,&cell);
          iVar9 = iVar9 + iVar21;
          uVar6 = uVar6 + iVar21;
          uVar14 = uVar14 + iVar21;
          iVar8 = iVar8 + iVar21;
          if (uVar10 != 0) {
            uVar26 = (ulong)uVar10;
            pcVar20 = "qua";
            uVar13 = 0x5df;
            goto LAB_00125c8a;
          }
        }
        iVar19 = iVar19 + uVar5;
        local_9c = local_9c + uVar5;
        local_120 = local_120 + uVar5;
        local_d0 = local_d0 + uVar5;
      }
      quad[4] = 3;
      local_128 = 0;
      for (iVar8 = 1; iVar8 < (int)local_a8; iVar8 = iVar8 + 1) {
        iVar19 = 1;
        uVar6 = local_128;
        while (iVar19 < (int)local_110) {
          quad[2] = uVar5 + uVar6;
          quad[3] = uVar5 + uVar6 + 1;
          quad[0] = uVar6 + 1;
          quad[1] = uVar6;
          uVar14 = ref_cell_add(pRVar1->cell[6],quad,&cell);
          uVar26 = (ulong)uVar14;
          iVar19 = iVar19 + 1;
          uVar6 = uVar6 + 1;
          if (uVar14 != 0) {
            pcVar20 = "qua";
            uVar13 = 0x5eb;
            goto LAB_00125c8a;
          }
        }
        local_128 = local_128 + uVar5;
      }
      quad[4] = 4;
      iVar8 = (int)local_110;
      local_c4 = (m + -1) * iVar8;
      local_120 = (m * 2 + -1) * iVar8;
      for (local_128 = 1; (int)local_128 < (int)local_a8; local_128 = local_128 + 1) {
        iVar19 = 1;
        iVar9 = local_c4;
        uVar6 = local_120;
        while (iVar19 < (int)local_110) {
          quad[0] = iVar9;
          quad[1] = iVar9 + 1;
          quad[2] = uVar6 + 1;
          quad[3] = uVar6;
          uVar14 = ref_cell_add(pRVar1->cell[6],quad,&cell);
          uVar26 = (ulong)uVar14;
          iVar19 = iVar19 + 1;
          iVar9 = iVar9 + 1;
          uVar6 = uVar6 + 1;
          if (uVar14 != 0) {
            pcVar20 = "qua";
            uVar13 = 0x5f7;
            goto LAB_00125c8a;
          }
        }
        local_120 = local_120 + m * iVar8;
        local_c4 = local_c4 + m * iVar8;
      }
      quad[4] = 7;
      local_128 = 0;
      uVar22 = 0;
      if (0 < (int)local_88) {
        uVar22 = local_88 & 0xffffffff;
      }
      local_ac = quad[4];
      for (local_120 = 1; uVar18 = uVar22, uVar6 = local_128, (int)local_120 < m;
          local_120 = local_120 + 1) {
        while( true ) {
          if ((int)uVar18 == 0) break;
          uVar14 = uVar6 + 1;
          quad[3] = (int)local_110 + uVar6;
          quad[2] = (int)local_110 + uVar6 + 1;
          quad[0] = uVar6;
          quad[1] = uVar14;
          local_b8 = uVar6;
          uStack_b4 = uVar14;
          uStack_b0 = quad[2];
          uVar6 = ref_cell_add(pRVar1->cell[3],(REF_INT *)&local_b8,&cell);
          if (uVar6 != 0) {
            uVar26 = (ulong)uVar6;
            pcVar20 = "tri";
            uVar13 = 0x607;
            goto LAB_00125c8a;
          }
          local_b8 = quad[0];
          uStack_b4 = quad[2];
          uStack_b0 = quad[3];
          uVar10 = ref_cell_add(pRVar1->cell[3],(REF_INT *)&local_b8,&cell);
          uVar26 = (ulong)uVar10;
          uVar18 = (ulong)((int)uVar18 - 1);
          uVar6 = uVar14;
          if (uVar10 != 0) {
            pcVar20 = "tri";
            uVar13 = 0x60b;
            goto LAB_00125c8a;
          }
        }
        local_128 = local_128 + (int)local_110;
      }
      quad[4] = 5;
      iVar19 = (int)local_88;
      local_ac = quad[4];
      for (iVar8 = 1; uVar22 = local_88, iVar9 = iVar19, iVar8 < m; iVar8 = iVar8 + 1) {
        while( true ) {
          if ((int)local_110 <= iVar9 + 1) break;
          quad[0] = (REF_INT)uVar22;
          uVar14 = quad[0] + 1;
          quad[3] = (int)local_110 + quad[0];
          quad[2] = (int)local_110 + quad[0] + 1;
          quad[1] = uVar14;
          local_b8 = quad[0];
          uStack_b4 = uVar14;
          uStack_b0 = quad[2];
          uVar6 = ref_cell_add(pRVar1->cell[3],(REF_INT *)&local_b8,&cell);
          if (uVar6 != 0) {
            uVar26 = (ulong)uVar6;
            pcVar20 = "tri";
            uVar13 = 0x61b;
            goto LAB_00125c8a;
          }
          local_b8 = quad[0];
          uStack_b4 = quad[2];
          uStack_b0 = quad[3];
          uVar6 = ref_cell_add(pRVar1->cell[3],(REF_INT *)&local_b8,&cell);
          uVar26 = (ulong)uVar6;
          uVar22 = (ulong)uVar14;
          iVar9 = iVar9 + 1;
          if (uVar6 != 0) {
            pcVar20 = "tri";
            uVar13 = 0x61f;
            goto LAB_00125c8a;
          }
        }
        local_88 = (ulong)(uint)((int)local_88 + (int)local_110);
      }
      quad[4] = 6;
      local_120 = uVar5 * iVar7;
      local_c8 = (iVar7 * m + 1) * (int)local_110;
      local_ac = quad[4];
      for (local_128 = 1; (int)local_128 < m; local_128 = local_128 + 1) {
        iVar8 = 1;
        uVar6 = local_120;
        uVar14 = local_c8;
        while (iVar8 < (int)local_110) {
          uVar10 = uVar6 + 1;
          uVar25 = uVar14 + 1;
          quad[0] = uVar10;
          quad[1] = uVar6;
          quad[2] = uVar14;
          quad[3] = uVar25;
          local_b8 = uVar6;
          uStack_b4 = uVar25;
          uStack_b0 = uVar10;
          uVar6 = ref_cell_add(pRVar1->cell[3],(REF_INT *)&local_b8,&cell);
          if (uVar6 != 0) {
            uVar26 = (ulong)uVar6;
            pcVar20 = "tri";
            uVar13 = 0x62f;
            goto LAB_00125c8a;
          }
          local_b8 = quad[1];
          uStack_b4 = quad[2];
          uStack_b0 = quad[3];
          uVar11 = ref_cell_add(pRVar1->cell[3],(REF_INT *)&local_b8,&cell);
          uVar26 = (ulong)uVar11;
          iVar8 = iVar8 + 1;
          uVar6 = uVar10;
          uVar14 = uVar25;
          if (uVar11 != 0) {
            pcVar20 = "tri";
            uVar13 = 0x633;
            goto LAB_00125c8a;
          }
        }
        local_c8 = local_c8 + (int)local_110;
        local_120 = local_120 + (int)local_110;
      }
      uVar6 = ref_node_initialize_n_global(local_38,(long)(int)(uVar5 * (int)local_a8));
      if (uVar6 == 0) {
        return 0;
      }
      uVar26 = (ulong)uVar6;
      pcVar20 = "init glob";
      uVar13 = 0x636;
    }
    else {
      uVar6 = ref_node_initialize_n_global(ref_node,(long)(m * l * iVar8));
      if (uVar6 == 0) {
        return 0;
      }
      uVar26 = (ulong)uVar6;
      pcVar20 = "init glob";
      uVar13 = 0x59c;
    }
  }
  else {
    uVar26 = (ulong)uVar5;
    pcVar20 = "create";
    uVar13 = 0x597;
  }
LAB_00125c8a:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",uVar13,
         "ref_fixture_pri_brick_args_grid",uVar26,pcVar20);
  return (REF_STATUS)uVar26;
}

Assistant:

REF_FCN REF_STATUS ref_fixture_pri_brick_args_grid(
    REF_GRID *ref_grid_ptr, REF_MPI ref_mpi, REF_DBL x0, REF_DBL x1, REF_DBL y0,
    REF_DBL y1, REF_DBL z0, REF_DBL z1, REF_INT l, REF_INT m, REF_INT n,
    REF_INT l0) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_INT global, node, hex[8], pri[6], cell;
  REF_INT quad[5], tri[4];

  REF_INT i, j, k;
  REF_DBL dx, dy, dz;

  l0 = MAX(0, l0);
  l0 = MIN(l0, l - 1);

  dx = (x1 - x0) / ((REF_DBL)(l - 1));
  dy = (y1 - y0) / ((REF_DBL)(m - 1));
  dz = (z1 - z0) / ((REF_DBL)(n - 1));

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create");
  ref_grid = *ref_grid_ptr;
  ref_node = ref_grid_node(ref_grid);

  if (!ref_mpi_once(ref_grid_mpi(ref_grid))) {
    RSS(ref_node_initialize_n_global(ref_node, l * m * n), "init glob");
    return REF_SUCCESS;
  }

#define ijk2node(i, j, k, l, m, n) ((i) + (j) * (l) + (k) * (l) * (m))

  for (k = 0; k < n; k++)
    for (j = 0; j < m; j++)
      for (i = 0; i < l; i++) {
        global = ijk2node(i, j, k, l, m, n);
        RSS(ref_node_add(ref_node, global, &node), "node");
        ref_node_xyz(ref_node, 0, node) = x0 + dx * (REF_DBL)i;
        ref_node_xyz(ref_node, 1, node) = y0 + dy * (REF_DBL)j;
        ref_node_xyz(ref_node, 2, node) = z0 + dz * (REF_DBL)k;
      }

#define ijk2hex(i, j, k, l, m, n, hex)                     \
  (hex)[0] = ijk2node((i)-1, (j)-1, (k)-1, (l), (m), (n)); \
  (hex)[1] = ijk2node((i), (j)-1, (k)-1, (l), (m), (n));   \
  (hex)[2] = ijk2node((i), (j), (k)-1, (l), (m), (n));     \
  (hex)[3] = ijk2node((i)-1, (j), (k)-1, (l), (m), (n));   \
  (hex)[4] = ijk2node((i)-1, (j)-1, (k), (l), (m), (n));   \
  (hex)[5] = ijk2node((i), (j)-1, (k), (l), (m), (n));     \
  (hex)[6] = ijk2node((i), (j), (k), (l), (m), (n));       \
  (hex)[7] = ijk2node((i)-1, (j), (k), (l), (m), (n));

  for (k = 1; k < n; k++)
    for (j = 1; j < m; j++)
      for (i = 1; i < l; i++) {
        ijk2hex(i, j, k, l, m, n, hex);
        pri[0] = hex[0];
        pri[1] = hex[1];
        pri[2] = hex[2];
        pri[3] = hex[4];
        pri[4] = hex[5];
        pri[5] = hex[6];
        RSS(ref_cell_add(ref_grid_pri(ref_grid), pri, &cell), "pri");
        pri[0] = hex[0];
        pri[1] = hex[2];
        pri[2] = hex[3];
        pri[3] = hex[4];
        pri[4] = hex[6];
        pri[5] = hex[7];
        RSS(ref_cell_add(ref_grid_pri(ref_grid), pri, &cell), "pri");
      }

  quad[4] = 1;
  i = 1;
  for (k = 1; k < n; k++)
    for (j = 1; j < m; j++) {
      ijk2hex(i, j, k, l, m, n, hex);
      quad[0] = hex[0];
      quad[1] = hex[3];
      quad[2] = hex[7];
      quad[3] = hex[4];
      RSS(ref_cell_add(ref_grid_qua(ref_grid), quad, &cell), "qua");
    }

  quad[4] = 2;
  i = l - 1;
  for (k = 1; k < n; k++)
    for (j = 1; j < m; j++) {
      ijk2hex(i, j, k, l, m, n, hex);
      quad[0] = hex[2];
      quad[1] = hex[1];
      quad[2] = hex[5];
      quad[3] = hex[6];
      RSS(ref_cell_add(ref_grid_qua(ref_grid), quad, &cell), "qua");
    }

  quad[4] = 3;
  j = 1;
  for (k = 1; k < n; k++)
    for (i = 1; i < l; i++) {
      ijk2hex(i, j, k, l, m, n, hex);
      quad[0] = hex[1];
      quad[1] = hex[0];
      quad[2] = hex[4];
      quad[3] = hex[5];
      RSS(ref_cell_add(ref_grid_qua(ref_grid), quad, &cell), "qua");
    }

  quad[4] = 4;
  j = m - 1;
  for (k = 1; k < n; k++)
    for (i = 1; i < l; i++) {
      ijk2hex(i, j, k, l, m, n, hex);
      quad[0] = hex[3];
      quad[1] = hex[2];
      quad[2] = hex[6];
      quad[3] = hex[7];
      RSS(ref_cell_add(ref_grid_qua(ref_grid), quad, &cell), "qua");
    }

  quad[4] = 7;
  tri[3] = quad[4];
  k = 1;
  for (j = 1; j < m; j++)
    for (i = 1; i < l0 + 1; i++) {
      ijk2hex(i, j, k, l, m, n, hex);
      quad[0] = hex[0];
      quad[1] = hex[1];
      quad[2] = hex[2];
      quad[3] = hex[3];
      tri[0] = quad[0];
      tri[1] = quad[1];
      tri[2] = quad[2];
      RSS(ref_cell_add(ref_grid_tri(ref_grid), tri, &cell), "tri");
      tri[0] = quad[0];
      tri[1] = quad[2];
      tri[2] = quad[3];
      RSS(ref_cell_add(ref_grid_tri(ref_grid), tri, &cell), "tri");
    }

  quad[4] = 5;
  tri[3] = quad[4];
  k = 1;
  for (j = 1; j < m; j++)
    for (i = l0 + 1; i < l; i++) {
      ijk2hex(i, j, k, l, m, n, hex);
      quad[0] = hex[0];
      quad[1] = hex[1];
      quad[2] = hex[2];
      quad[3] = hex[3];
      tri[0] = quad[0];
      tri[1] = quad[1];
      tri[2] = quad[2];
      RSS(ref_cell_add(ref_grid_tri(ref_grid), tri, &cell), "tri");
      tri[0] = quad[0];
      tri[1] = quad[2];
      tri[2] = quad[3];
      RSS(ref_cell_add(ref_grid_tri(ref_grid), tri, &cell), "tri");
    }

  quad[4] = 6;
  tri[3] = quad[4];
  k = n - 1;
  for (j = 1; j < m; j++)
    for (i = 1; i < l; i++) {
      ijk2hex(i, j, k, l, m, n, hex);
      quad[0] = hex[5];
      quad[1] = hex[4];
      quad[2] = hex[7];
      quad[3] = hex[6];
      tri[0] = quad[1];
      tri[1] = quad[3];
      tri[2] = quad[0];
      RSS(ref_cell_add(ref_grid_tri(ref_grid), tri, &cell), "tri");
      tri[0] = quad[1];
      tri[1] = quad[2];
      tri[2] = quad[3];
      RSS(ref_cell_add(ref_grid_tri(ref_grid), tri, &cell), "tri");
    }

  RSS(ref_node_initialize_n_global(ref_node, l * m * n), "init glob");

  return REF_SUCCESS;
}